

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_105c52d::
BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
::RunTest(BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
          *this,int block_size,int run_times)

{
  long in_RDI;
  int in_stack_000000f0;
  int in_stack_000000f4;
  int in_stack_000000f8;
  int in_stack_000000fc;
  BlendA64MaskTest<void_(*)(unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_const_unsigned_char_*,_unsigned_int,_int,_int,_int,_int),_unsigned_char,_unsigned_char>
  *in_stack_00000100;
  
  *(undefined4 *)(in_RDI + 0x60064) = 0;
  while (*(int *)(in_RDI + 0x60064) < 2) {
    *(undefined4 *)(in_RDI + 0x60060) = 0;
    while (*(int *)(in_RDI + 0x60060) < 2) {
      RunOneTest(in_stack_00000100,in_stack_000000fc,in_stack_000000f8,in_stack_000000f4,
                 in_stack_000000f0);
      *(int *)(in_RDI + 0x60060) = *(int *)(in_RDI + 0x60060) + 1;
    }
    *(int *)(in_RDI + 0x60064) = *(int *)(in_RDI + 0x60064) + 1;
  }
  return;
}

Assistant:

void RunTest(int block_size, int run_times) {
    for (subx_ = 0; subx_ <= 1; subx_++) {
      for (suby_ = 0; suby_ <= 1; suby_++) {
        RunOneTest(block_size, subx_, suby_, run_times);
      }
    }
  }